

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset
          )

{
  long i_00;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  double *pdVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  double dVar11;
  double x2_1;
  double x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<double> local_a0;
  double local_90;
  double x2;
  double x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_38 [8];
  SquareMatrix<double> mat1;
  int qubit;
  int offset_local;
  SquareMatrix<double> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate1<double> *this_local;
  
  mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_ = offset;
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  iVar5 = dense::SquareMatrix<double>::size(matrix);
  bVar9 = (byte)nbQubits;
  if (iVar5 != 1 << (bVar9 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  iVar4 = (*(this->super_QObject<double>)._vptr_QObject[3])();
  mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl._0_4_ =
       iVar4 + mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl._4_4_;
  if (nbQubits <=
      (int)mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  (*(this->super_QObject<double>)._vptr_QObject[7])();
  dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,(SquareMatrix<double> *)local_38);
  bVar10 = (byte)(int)mat1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<double>::operator*=(matrix,(SquareMatrix<double> *)local_38);
    }
    else {
      nRight = (int64_t)(1 << (bVar10 & 0x1f));
      i = (int64_t)(1 << ((bVar9 - bVar10) - 1 & 0x1f));
      for (k = 0; iVar5 = k, iVar6 = dense::SquareMatrix<double>::rows(matrix), iVar5 < iVar6;
          k = k + 1) {
        for (j = 0; j < nRight; j = j + 1) {
          for (j1 = 0; j1 < i; j1 = j1 + 1) {
            j2 = j1 + j * i * 2;
            x1 = (double)(j2 + i);
            pdVar7 = dense::SquareMatrix<double>::operator()(matrix,k,j2);
            x2 = *pdVar7;
            pdVar7 = dense::SquareMatrix<double>::operator()(matrix,k,(int64_t)x1);
            local_90 = *pdVar7;
            pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,0,0);
            dVar2 = x2;
            dVar1 = *pdVar7;
            pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,1,0);
            dVar11 = *pdVar7 * local_90;
            pdVar7 = dense::SquareMatrix<double>::operator()(matrix,k,j2);
            *pdVar7 = dVar1 * dVar2 + dVar11;
            pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,0,1);
            dVar2 = x2;
            dVar1 = *pdVar7;
            pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,1,1);
            dVar11 = *pdVar7 * local_90;
            pdVar7 = dense::SquareMatrix<double>::operator()(matrix,k,(int64_t)x1);
            *pdVar7 = dVar1 * dVar2 + dVar11;
          }
        }
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<double>::SquareMatrix
              ((SquareMatrix<double> *)&nLeft_1,(SquareMatrix<double> *)local_38);
    dense::operator*((dense *)&local_a0,(SquareMatrix<double> *)&nLeft_1,matrix);
    dense::SquareMatrix<double>::operator=(matrix,&local_a0);
    dense::SquareMatrix<double>::~SquareMatrix(&local_a0);
    dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&nLeft_1);
  }
  else {
    lVar8 = (long)(1 << ((bVar9 - bVar10) - 1 & 0x1f));
    for (k_1 = 0; iVar5 = dense::SquareMatrix<double>::cols(matrix), k_1 < iVar5; k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << (bVar10 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar8; i1 = i1 + 1) {
          i_00 = i1 + i_1 * lVar8 * 2;
          pdVar7 = dense::SquareMatrix<double>::operator()(matrix,i_00,k_1);
          dVar1 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()(matrix,i_00 + lVar8,k_1);
          dVar2 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,0,0);
          dVar11 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,0,1);
          dVar3 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()(matrix,i_00,k_1);
          *pdVar7 = dVar11 * dVar1 + dVar3 * dVar2;
          pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,1,0);
          dVar11 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)local_38,1,1);
          dVar3 = *pdVar7;
          pdVar7 = dense::SquareMatrix<double>::operator()(matrix,i_00 + lVar8,k_1);
          *pdVar7 = dVar11 * dVar1 + dVar3 * dVar2;
        }
      }
    }
  }
  dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_38);
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }